

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlChar * xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader,int no)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  int iVar4;
  xmlNs *pxVar5;
  _xmlAttr *p_Var6;
  
  if ((((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->node, pxVar1 != (xmlNodePtr)0x0)) &&
      (reader->curnode == (xmlNodePtr)0x0)) && (pxVar1->type == XML_ELEMENT_NODE)) {
    pxVar5 = (xmlNs *)&pxVar1->nsDef;
    iVar4 = -1;
    iVar2 = 2;
    do {
      iVar4 = iVar4 + 1;
      pxVar5 = pxVar5->next;
      iVar2 = iVar2 + -1;
      if (no <= iVar4) break;
    } while (pxVar5 != (xmlNs *)0x0);
    if (pxVar5 != (xmlNs *)0x0) {
      pxVar3 = readerStrdup(reader,pxVar5->href);
      return pxVar3;
    }
    p_Var6 = pxVar1->properties;
    if (p_Var6 != (_xmlAttr *)0x0) {
      if (iVar4 < no) {
        iVar4 = no;
      }
      iVar4 = iVar4 + iVar2;
      while (iVar4 = iVar4 + -1, iVar4 != 0) {
        p_Var6 = p_Var6->next;
        if (p_Var6 == (_xmlAttr *)0x0) {
          return (xmlChar *)0x0;
        }
      }
      if (p_Var6->children != (xmlNode *)0x0) {
        pxVar3 = xmlNodeListGetString(pxVar1->doc,p_Var6->children,1);
        if (pxVar3 != (xmlChar *)0x0) {
          return pxVar3;
        }
        xmlTextReaderErrMemory(reader);
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader, int no) {
    xmlChar *ret;
    int i;
    xmlAttrPtr cur;
    xmlNsPtr ns;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);
    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    ns = reader->node->nsDef;
    for (i = 0;(i < no) && (ns != NULL);i++) {
	ns = ns->next;
    }
    if (ns != NULL)
	return(readerStrdup(reader, ns->href));

    cur = reader->node->properties;
    if (cur == NULL)
	return(NULL);
    for (;i < no;i++) {
	cur = cur->next;
	if (cur == NULL)
	    return(NULL);
    }
    /* TODO walk the DTD if present */

    if (cur->children == NULL)
        return(NULL);
    ret = xmlNodeListGetString(reader->node->doc, cur->children, 1);
    if (ret == NULL)
        xmlTextReaderErrMemory(reader);
    return(ret);
}